

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::TextDiffReporter::TextDiffReporter(TextDiffReporter *this,ostream *stream)

{
  initializer_list<std::shared_ptr<ApprovalTests::Reporter>_> __l;
  _func_int **in_RSI;
  Reporter *in_RDI;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  reporters;
  shared_ptr<ApprovalTests::GenericDiffReporter> *in_stack_fffffffffffffe98;
  shared_ptr<ApprovalTests::Reporter> *in_stack_fffffffffffffea0;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *in_stack_fffffffffffffeb0;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *in_stack_fffffffffffffeb8;
  FirstWorkingReporter *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffec8;
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  *in_stack_fffffffffffffed0;
  undefined8 ***pppuVar1;
  iterator in_stack_fffffffffffffed8;
  undefined8 ***pppuVar2;
  size_type in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 *puVar3;
  string *in_stack_fffffffffffffef8;
  string *path;
  undefined1 local_d9 [72];
  allocator local_91;
  string local_90 [48];
  undefined8 **local_60;
  undefined1 **local_58 [2];
  undefined1 local_48 [16];
  undefined8 **local_38;
  undefined8 local_30;
  _func_int **local_10;
  
  local_10 = in_RSI;
  Reporter::Reporter(in_RDI);
  in_RDI->_vptr_Reporter = (_func_int **)&PTR__TextDiffReporter_0027c1c0;
  ::std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>::
  unique_ptr<std::default_delete<ApprovalTests::Reporter>,void>
            ((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> *)
             in_stack_fffffffffffffea0);
  in_RDI[2]._vptr_Reporter = local_10;
  local_60 = local_58;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_90,"diff",&local_91);
  CustomReporter::createForegroundReporter
            (in_stack_fffffffffffffef8,(Type)((ulong)in_stack_fffffffffffffef0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffef0 >> 0x18,0));
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::GenericDiffReporter,void>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  puVar3 = local_48;
  path = (string *)local_d9;
  local_60 = (undefined8 **)puVar3;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_d9 + 1),"C:/Windows/System32/fc.exe",(allocator *)path);
  CustomReporter::createForegroundReporter
            (path,(Type)((ulong)puVar3 >> 0x20),SUB81((ulong)puVar3 >> 0x18,0));
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::GenericDiffReporter,void>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_38 = local_58;
  local_30 = 2;
  ::std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>::allocator
            ((allocator<std::shared_ptr<ApprovalTests::Reporter>_> *)0x1f213a);
  __l._M_len = in_stack_fffffffffffffee0;
  __l._M_array = in_stack_fffffffffffffed8;
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::vector(in_stack_fffffffffffffed0,__l,in_stack_fffffffffffffec8);
  ::std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>::~allocator
            ((allocator<std::shared_ptr<ApprovalTests::Reporter>_> *)0x1f216b);
  pppuVar2 = (undefined8 ***)local_58;
  pppuVar1 = &local_38;
  do {
    pppuVar1 = pppuVar1 + -2;
    ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
              ((shared_ptr<ApprovalTests::Reporter> *)0x1f2194);
  } while (pppuVar1 != pppuVar2);
  ::std::shared_ptr<ApprovalTests::GenericDiffReporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::GenericDiffReporter> *)0x1f21b5);
  ::std::__cxx11::string::~string((string *)(local_d9 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_d9);
  ::std::shared_ptr<ApprovalTests::GenericDiffReporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::GenericDiffReporter> *)0x1f21dc);
  ::std::__cxx11::string::~string(local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  operator_new(0x20);
  FirstWorkingReporter::FirstWorkingReporter(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ::std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>::
  unique_ptr<std::default_delete<ApprovalTests::Reporter>,void>
            ((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> *)
             in_stack_fffffffffffffea0,(pointer)in_stack_fffffffffffffe98);
  ::std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>::
  operator=((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> *)
            in_stack_fffffffffffffea0,
            (unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> *)
            in_stack_fffffffffffffe98);
  ::std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>::
  ~unique_ptr((unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> *)
              in_stack_fffffffffffffeb0);
  ::std::
  vector<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
  ::~vector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

TextDiffReporter::TextDiffReporter(std::ostream& stream) : stream_(stream)
    {
        std::vector<std::shared_ptr<Reporter>> reporters = {
            CustomReporter::createForegroundReporter("diff", Type::TEXT, true),
            CustomReporter::createForegroundReporter(
                "C:/Windows/System32/fc.exe", Type::TEXT_AND_IMAGE, true)};
        m_reporter = std::unique_ptr<Reporter>(new FirstWorkingReporter(reporters));
    }